

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearray.cpp
# Opt level: O2

QByteArray * __thiscall QByteArray::append(QByteArray *this,QByteArray *ba)

{
  char *pcVar1;
  long lVar2;
  QByteArrayView a;
  QByteArrayView v;
  
  pcVar1 = (ba->d).ptr;
  if (pcVar1 != (char *)0x0) {
    if ((this->d).ptr == (char *)0x0) {
      if ((ba->d).d == (Data *)0x0) {
        v.m_data = pcVar1;
        v.m_size = (ba->d).size;
        assign(this,v);
      }
      else {
        QArrayDataPointer<char>::operator=(&this->d,&ba->d);
      }
    }
    else {
      lVar2 = (ba->d).size;
      if (lVar2 != 0) {
        a.m_data = pcVar1;
        a.m_size = lVar2;
        append(this,a);
      }
    }
  }
  return this;
}

Assistant:

QByteArray &QByteArray::append(const QByteArray &ba)
{
    if (!ba.isNull()) {
        if (isNull()) {
            if (Q_UNLIKELY(!ba.d.isMutable()))
                assign(ba); // fromRawData, so we do a deep copy
            else
                operator=(ba);
        } else if (ba.size()) {
            append(QByteArrayView(ba));
        }
    }
    return *this;
}